

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int16_suite::fail_array64_int16_missing_length_four(void)

{
  value_type input [5];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [8];
  decoder local_38;
  
  local_38.input._M_str = local_40;
  local_40[4] = 0;
  local_40[0] = 0xda;
  local_40[1] = '\x04';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_38.input._M_len = 5;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_44 = local_38.current.code;
  local_48 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x805,"void compact_int16_suite::fail_array64_int16_missing_length_four()",&local_44,
             &local_48);
  return;
}

Assistant:

void fail_array64_int16_missing_length_four()
{
    const value_type input[] = { token::code::array64_int16, 0x04, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}